

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

bech32_error bech32_stripUnknownChars(char *dst,size_t dstlen,char *src,size_t srclen)

{
  bech32_error bVar1;
  unsigned_long __n2;
  string result;
  string inputStr;
  
  if (dst == (char *)0x0 || src == (char *)0x0) {
    bVar1 = E_BECH32_NULL_ARGUMENT;
  }
  else if (srclen < dstlen) {
    bVar1 = E_BECH32_LENGTH_TOO_SHORT;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inputStr,src,(allocator<char> *)&result);
    bech32::stripUnknownChars(&result,&inputStr);
    if (dstlen < result._M_string_length + 1) {
      bVar1 = E_BECH32_LENGTH_TOO_SHORT;
    }
    else {
      if (result._M_string_length != 0) {
        memmove(dst,result._M_dataplus._M_p,result._M_string_length);
      }
      dst[result._M_string_length] = '\0';
      bVar1 = E_BECH32_SUCCESS;
    }
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&inputStr);
  }
  return bVar1;
}

Assistant:

bech32_error bech32_stripUnknownChars(
        char *dst, size_t dstlen,
        const char *src, size_t srclen) {

    if(src == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dst == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dstlen > srclen)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::string inputStr(src);
    std::string result = bech32::stripUnknownChars(inputStr);
    if(dstlen < result.size()+1)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::copy_n(result.begin(), result.size(), dst);
    dst[result.size()] = '\0';

    return E_BECH32_SUCCESS;
}